

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QPDFEmbeddedFileDocumentHelper.cc
# Opt level: O3

bool __thiscall
QPDFEmbeddedFileDocumentHelper::removeEmbeddedFile
          (QPDFEmbeddedFileDocumentHelper *this,string *name)

{
  QPDFNameTreeObjectHelper *this_00;
  QPDF *this_01;
  bool bVar1;
  bool bVar2;
  pointer pTVar3;
  QPDFObjGen og;
  iterator *other;
  QPDFObjectHandle oh;
  iterator iter;
  QPDFObjectHandle QStack_b8;
  iterator local_a8;
  iterator local_60;
  
  this_00 = (((this->m).
              super___shared_ptr<QPDFEmbeddedFileDocumentHelper::Members,_(__gnu_cxx::_Lock_policy)2>
             ._M_ptr)->embedded_files).
            super___shared_ptr<QPDFNameTreeObjectHelper,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  if (this_00 == (QPDFNameTreeObjectHelper *)0x0) {
    bVar1 = false;
  }
  else {
    QPDFNameTreeObjectHelper::find(&local_60,this_00,name,false);
    QPDFNameTreeObjectHelper::end
              (&local_a8,
               (((this->m).
                 super___shared_ptr<QPDFEmbeddedFileDocumentHelper::Members,_(__gnu_cxx::_Lock_policy)2>
                ._M_ptr)->embedded_files).
               super___shared_ptr<QPDFNameTreeObjectHelper,_(__gnu_cxx::_Lock_policy)2>._M_ptr);
    other = &local_a8;
    bVar1 = QPDFNameTreeObjectHelper::iterator::operator==(&local_60,other);
    QPDFNameTreeObjectHelper::iterator::~iterator(&local_a8);
    if (!bVar1) {
      pTVar3 = QPDFNameTreeObjectHelper::iterator::operator->[abi_cxx11_(&local_60);
      local_a8._vptr_iterator =
           (_func_int **)
           (pTVar3->second).super_BaseHandle.obj.
           super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
      local_a8.impl.super___shared_ptr<NNTreeIterator,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
           (element_type *)
           (pTVar3->second).super_BaseHandle.obj.
           super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
      if (local_a8.impl.super___shared_ptr<NNTreeIterator,_(__gnu_cxx::_Lock_policy)2>._M_ptr !=
          (element_type *)0x0) {
        if (__libc_single_threaded == '\0') {
          LOCK();
          *(int *)&(local_a8.impl.super___shared_ptr<NNTreeIterator,_(__gnu_cxx::_Lock_policy)2>.
                   _M_ptr)->impl =
               *(int *)&(local_a8.impl.
                         super___shared_ptr<NNTreeIterator,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
                        impl + 1;
          UNLOCK();
        }
        else {
          *(int *)&(local_a8.impl.super___shared_ptr<NNTreeIterator,_(__gnu_cxx::_Lock_policy)2>.
                   _M_ptr)->impl =
               *(int *)&(local_a8.impl.
                         super___shared_ptr<NNTreeIterator,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
                        impl + 1;
        }
      }
      QPDFNameTreeObjectHelper::iterator::remove(&local_60,(char *)other);
      bVar2 = QPDFObjectHandle::isIndirect((QPDFObjectHandle *)&local_a8);
      if (bVar2) {
        this_01 = (this->super_QPDFDocumentHelper).qpdf;
        og = QPDFObjectHandle::getObjGen((QPDFObjectHandle *)&local_a8);
        QPDFObjectHandle::newNull();
        QPDF::replaceObject(this_01,og,&QStack_b8);
        if (QStack_b8.super_BaseHandle.obj.
            super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
            (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                    (QStack_b8.super_BaseHandle.obj.
                     super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi);
        }
      }
      if (local_a8.impl.super___shared_ptr<NNTreeIterator,_(__gnu_cxx::_Lock_policy)2>._M_ptr !=
          (element_type *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                   local_a8.impl.super___shared_ptr<NNTreeIterator,_(__gnu_cxx::_Lock_policy)2>.
                   _M_ptr);
      }
    }
    bVar1 = !bVar1;
    QPDFNameTreeObjectHelper::iterator::~iterator(&local_60);
  }
  return bVar1;
}

Assistant:

bool
QPDFEmbeddedFileDocumentHelper::removeEmbeddedFile(std::string const& name)
{
    if (!hasEmbeddedFiles()) {
        return false;
    }
    auto iter = m->embedded_files->find(name);
    if (iter == m->embedded_files->end()) {
        return false;
    }
    auto oh = iter->second;
    iter.remove();
    if (oh.isIndirect()) {
        this->qpdf.replaceObject(oh.getObjGen(), QPDFObjectHandle::newNull());
    }

    return true;
}